

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O1

vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *
anon_unknown.dwarf_23d32::gen3
          (vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *__return_storage_ptr__,int *Budget
          ,int Width)

{
  int iVar1;
  Value *pVVar2;
  Value *pVVar3;
  Value *pVVar4;
  bool ConstOK;
  initializer_list<llvm::Value_*> __l;
  Value *local_50;
  Value *local_48;
  Value *local_40;
  allocator_type local_31;
  
  pVVar2 = genVal(Budget,Width,true,true);
  pVVar3 = genVal(Budget,Width,true,true);
  if (pVVar2 != (Value *)0x0) {
    ConstOK = true;
    if ((byte)pVVar2[0x10] < 0x14) {
      if (pVVar3 == (Value *)0x0) goto LAB_002626f8;
      if ((byte)pVVar3[0x10] < 0x14) {
        ConstOK = false;
      }
      else {
        ConstOK = (byte)((char)pVVar3[0x10] - 0xdU) < 0xfe;
      }
    }
    pVVar4 = genVal(Budget,Width,ConstOK,true);
    iVar1 = rand();
    local_50 = pVVar2;
    local_48 = pVVar2;
    local_40 = pVVar2;
    switch(iVar1 % 6) {
    case 0:
      local_48 = pVVar3;
      local_40 = pVVar4;
      break;
    case 1:
      local_48 = pVVar4;
      local_40 = pVVar3;
      break;
    case 2:
      local_50 = pVVar3;
      local_40 = pVVar4;
      break;
    case 3:
      local_50 = pVVar3;
      local_48 = pVVar4;
      break;
    case 4:
      local_50 = pVVar4;
      local_40 = pVVar3;
      break;
    case 5:
      local_50 = pVVar4;
      local_48 = pVVar3;
      break;
    default:
      die("false failed at line __LINE__");
    }
    __l._M_array = &local_50;
    __l._M_len = 3;
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::vector
              (__return_storage_ptr__,__l,&local_31);
    return __return_storage_ptr__;
  }
LAB_002626f8:
  __assert_fail("Val && \"isa<> used on a null pointer\"",
                "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x68,
                "static bool llvm::isa_impl_cl<llvm::Constant, const llvm::Value *>::doit(const From *) [To = llvm::Constant, From = const llvm::Value *]"
               );
}

Assistant:

std::vector<Value *> gen3(int &Budget, int Width) {
  auto A = genVal(Budget, Width, true);
  auto B = genVal(Budget, Width, true);
  auto C = genVal(Budget, Width,
                  (!isa<Constant>(A) && !isa<UndefValue>(A)) ||
                      (!isa<Constant>(B) && !isa<UndefValue>(B)));
  switch (rand() % 6) {
  case 0:
    return std::vector{A, B, C};
  case 1:
    return std::vector{A, C, B};
  case 2:
    return std::vector{B, A, C};
  case 3:
    return std::vector{B, C, A};
  case 4:
    return std::vector{C, A, B};
  case 5:
    return std::vector{C, B, A};
  }
  assert(false);
}